

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O0

int cstep(double *stx,double *fx,double *dx,double *sty,double *fy,double *dy,double *stp,double *fp
         ,double *dp,int *brackt,double stpmin,double stpmax)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double theta;
  double stpq;
  double stpf;
  double stpc;
  double sgnd;
  double s;
  double r;
  double q;
  double p66;
  double p;
  double gamma;
  int bound;
  int info;
  double stpmax_local;
  double stpmin_local;
  double *dy_local;
  double *fy_local;
  double *sty_local;
  double *dx_local;
  double *fx_local;
  double *stx_local;
  
  if ((((*brackt == 1) &&
       ((dVar3 = *stp, dVar2 = pmin(*stx,*sty), dVar3 <= dVar2 ||
        (dVar3 = *stp, dVar2 = pmax(*stx,*sty), dVar2 <= dVar3)))) || (0.0 <= *dx * (*stp - *stx)))
     || (stpmax < stpmin)) {
    stx_local._4_4_ = 0;
  }
  else {
    dVar3 = *dp * (*dx / ABS(*dx));
    if (*fp < *fx || *fp == *fx) {
      if (0.0 <= dVar3) {
        if (ABS(*dx) <= ABS(*dp)) {
          gamma._4_4_ = 4;
          bVar1 = false;
          if (*brackt == 1) {
            dVar2 = ((*fp - *fy) * 3.0) / (*sty - *stp) + *dy + *dp;
            dVar4 = pmax(ABS(dVar2),ABS(*dy));
            dVar4 = pmax(dVar4,ABS(*dp));
            dVar5 = sqrt((dVar2 / dVar4) * (dVar2 / dVar4) + -((*dy / dVar4) * (*dp / dVar4)));
            p = dVar4 * dVar5;
            if (*sty <= *stp && *stp != *sty) {
              p = -p;
            }
            stpq = (((p - *dp) + dVar2) / ((p - *dp) + p + *dy)) * (*sty - *stp) + *stp;
          }
          else {
            stpq = stpmin;
            if (*stx <= *stp && *stp != *stx) {
              stpq = stpmax;
            }
          }
        }
        else {
          gamma._4_4_ = 3;
          bVar1 = true;
          dVar2 = ((*fx - *fp) * 3.0) / (*stp - *stx) + *dx + *dp;
          dVar4 = pmax(ABS(dVar2),ABS(*dx));
          dVar4 = pmax(dVar4,ABS(*dp));
          dVar5 = pmax(0.0,(dVar2 / dVar4) * (dVar2 / dVar4) + -((*dx / dVar4) * (*dp / dVar4)));
          dVar5 = sqrt(dVar5);
          p = dVar4 * dVar5;
          if (*stx <= *stp && *stp != *stx) {
            p = -p;
          }
          dVar2 = ((p - *dp) + dVar2) / (p + (*dx - *dp) + p);
          if ((0.0 <= dVar2) || ((p == 0.0 && (!NAN(p))))) {
            stpf = stpmin;
            if (*stx <= *stp && *stp != *stx) {
              stpf = stpmax;
            }
          }
          else {
            stpf = dVar2 * (*stx - *stp) + *stp;
          }
          stpq = (*dp / (*dp - *dx)) * (*stx - *stp) + *stp;
          if (*brackt == 1) {
            if (ABS(*stp - stpf) < ABS(*stp - stpq)) {
              stpq = stpf;
            }
          }
          else if (ABS(*stp - stpq) < ABS(*stp - stpf)) {
            stpq = stpf;
          }
        }
      }
      else {
        gamma._4_4_ = 2;
        bVar1 = false;
        dVar2 = ((*fx - *fp) * 3.0) / (*stp - *stx) + *dx + *dp;
        dVar4 = pmax(ABS(dVar2),ABS(*dx));
        dVar4 = pmax(dVar4,ABS(*dp));
        dVar5 = sqrt((dVar2 / dVar4) * (dVar2 / dVar4) + -((*dx / dVar4) * (*dp / dVar4)));
        p = dVar4 * dVar5;
        if (*stx <= *stp && *stp != *stx) {
          p = -p;
        }
        dVar2 = (((p - *dp) + dVar2) / ((p - *dp) + p + *dx)) * (*stx - *stp) + *stp;
        stpq = (*dp / (*dp - *dx)) * (*stx - *stp) + *stp;
        if (ABS(stpq - *stp) < ABS(dVar2 - *stp)) {
          stpq = dVar2;
        }
        *brackt = 1;
      }
    }
    else {
      gamma._4_4_ = 1;
      bVar1 = true;
      dVar2 = ((*fx - *fp) * 3.0) / (*stp - *stx) + *dx + *dp;
      dVar4 = pmax(ABS(dVar2),ABS(*dx));
      dVar4 = pmax(dVar4,ABS(*dp));
      dVar5 = sqrt((dVar2 / dVar4) * (dVar2 / dVar4) + -((*dx / dVar4) * (*dp / dVar4)));
      p = dVar4 * dVar5;
      if (*stp < *stx) {
        p = -p;
      }
      stpq = (((p - *dx) + dVar2) / ((p - *dx) + p + *dp)) * (*stp - *stx) + *stx;
      dVar2 = ((*dx / ((*fx - *fp) / (*stp - *stx) + *dx)) / 2.0) * (*stp - *stx) + *stx;
      if (ABS(dVar2 - *stx) <= ABS(stpq - *stx)) {
        stpq = stpq + (dVar2 - stpq) / 2.0;
      }
      *brackt = 1;
    }
    if (*fp < *fx || *fp == *fx) {
      if (dVar3 < 0.0) {
        *sty = *stx;
        *fy = *fx;
        *dy = *dx;
      }
      *stx = *stp;
      *fx = *fp;
      *dx = *dp;
    }
    else {
      *sty = *stp;
      *fy = *fp;
      *dy = *dp;
    }
    dVar3 = pmin(stpmax,stpq);
    dVar3 = pmax(stpmin,dVar3);
    *stp = dVar3;
    if ((*brackt == 1) && (bVar1)) {
      if (*sty < *stx || *sty == *stx) {
        dVar3 = pmax((*sty - *stx) * 0.66 + *stx,*stp);
        *stp = dVar3;
      }
      else {
        dVar3 = pmin((*sty - *stx) * 0.66 + *stx,*stp);
        *stp = dVar3;
      }
    }
    stx_local._4_4_ = gamma._4_4_;
  }
  return stx_local._4_4_;
}

Assistant:

int cstep(double *stx,double *fx,double *dx,double *sty,double *fy,double *dy,double *stp,double *fp,double *dp,int *brackt,
                       double  stpmin,double stpmax) {
	int info,bound;
	double gamma, p, p66, q, r, s, sgnd, stpc, stpf, stpq, theta;

	info = 0;
	p66 = 0.66;

	if ((*brackt == 1 && (*stp <= pmin(*stx, *sty) || *stp >= pmax(*stx, *sty))) || *dx*(*stp - *stx) >= 0.0 || stpmax < stpmin) {
		return info;
	}

	sgnd = (*dp) * (*dx / fabs(*dx));

	/*
	 First case. A higher function value. (fp > fx)
     The minimum is bracketed. If the cubic step is closer
	 to stx than the quadratic step, the cubic step is taken,
     else the average of the cubic and quadratic steps is taken.
	*/

	if (*fp > *fx) {
		info = 1;
		bound = 1;
		theta = 3 * (*fx - *fp) / (*stp - *stx) + *dx + *dp;
		s = pmax(fabs(theta), fabs(*dx));
		s = pmax(s, fabs(*dp));
		gamma = s*sqrt((theta / s)*(theta/s) - (*dx / s)*(*dp / s));
		if (*stp < *stx) {
			gamma = -gamma;
		}
		p = (gamma - *dx) + theta;
		q = ((gamma - *dx) + gamma) + *dp;
		r = p / q;
		stpc = *stx + r*(*stp - *stx);
		stpq = *stx + ((*dx / ((*fx - *fp) / (*stp - *stx) + *dx)) / 2)*(*stp - *stx);

		if (fabs(stpc - *stx) < fabs(stpq - *stx)) {
			stpf = stpc;
		} else {
			stpf = stpc + (stpq - stpc) / 2;
		}
		*brackt = 1;
	} else if (sgnd < 0.0) {
		/*
		Second case. A lower function value and derivatives of
	    opposite sign. The minimum is bracketed. If the cubic
	    step is closer to stx than the quadratic (secant) step, 
	    the cubic step is taken, else the quadratic step is taken.
		*/

		info = 2;
		bound = 0;
		theta = 3 * (*fx - *fp) / (*stp - *stx) + *dx + *dp;
		s = pmax(fabs(theta), fabs(*dx));
		s = pmax(s, fabs(*dp));
		gamma = s*sqrt((theta / s)*(theta / s) - (*dx / s)*(*dp / s));
		if (*stp > *stx) {
			gamma = -gamma;
		}
		p = (gamma - *dp) + theta;
		q = ((gamma - *dp) + gamma) + *dx;
		r = p / q;
		stpc = *stp + r*(*stx - *stp);
		stpq = *stp + (*dp / (*dp - *dx))*(*stx - *stp);
		if (fabs(stpc - *stp) > fabs(stpq - *stp)) {
			stpf = stpc;
		} else {
			stpf = stpq;
		}
		*brackt = 1;
	}
	else if (fabs(*dp) < fabs(*dx)) {
		/*
     Third case. A lower function value, derivatives of the
     same sign, and the magnitude of the derivative decreases.
     The cubic step is only used if the cubic tends to infinity 
     in the direction of the step or if the minimum of the cubic
     is beyond stp. Otherwise the cubic step is defined to be 
     either stpmin or stpmax. The quadratic (secant) step is also 
     computed and if the minimum is bracketed then the the step 
     closest to stx is taken, else the step farthest away is taken.
		*/

		info = 3;
		bound = 1;
		theta = 3 * (*fx - *fp) / (*stp - *stx) + *dx + *dp;
		s = pmax(fabs(theta), fabs(*dx));
		s = pmax(s, fabs(*dp));

		/*
		 The case gamma = 0 only arises if the cubic does not tend
         to infinity in the direction of the step.
		*/

		gamma = s*sqrt(pmax(0., (theta / s)*(theta / s) - (*dx / s)*(*dp / s)));
		if (*stp > *stx) {
			gamma = -gamma;
		}
		p = (gamma - *dp) + theta;
		q = (gamma + (*dx - *dp)) + gamma;
		r = p / q;

		if (r < 0.0 && gamma != 0.0) {
			stpc = *stp + r*(*stx - *stp);
		} else if (*stp > *stx) {
			stpc = stpmax;
		} else {
			stpc = stpmin;
		}
		stpq = *stp + (*dp / (*dp - *dx))*(*stx - *stp);
		if (*brackt == 1) {
			if (fabs(*stp - stpc) < fabs(*stp - stpq)) {
				stpf = stpc;
			} else {
				stpf = stpq;
			}
		} else {
			if (fabs(*stp - stpc) > fabs(*stp - stpq)) {
				stpf = stpc;
			} else {
				stpf = stpq;
			}
		}
	}
	else {
		/*
     Fourth case. A lower function value, derivatives of the
     same sign, and the magnitude of the derivative does
     not decrease. If the minimum is not bracketed, the step
     is either stpmin or stpmax, else the cubic step is taken.

		*/
		info = 4;
		bound = 0;
		if (*brackt == 1) {
			theta = 3 * (*fp - *fy) / (*sty - *stp) + *dy + *dp;
			s = pmax(fabs(theta), fabs(*dy));
			s = pmax(s,fabs(*dp));
			gamma = s*sqrt((theta / s)*(theta / s) - (*dy / s)*(*dp / s));
			if (*stp > *sty) {
				gamma = -gamma;
			}
			p = (gamma - *dp) + theta;
			q = ((gamma - *dp) + gamma) + *dy;
			r = p / q;
			stpc = *stp + r*(*sty - *stp);
			stpf = stpc;
		}
		else if (*stp > *stx) {
			stpf = stpmax;
		}
		else {
			stpf = stpmin;
		}
		
	}
	/*
	Update the interval of uncertainty. This update does not
    depend on the new step or the case analysis above.
	*/

	if (*fp > *fx) {
		*sty = *stp;
		*fy = *fp;
		*dy = *dp;
	} else { 
		if (sgnd < 0.0) {
			*sty = *stx;
			*fy = *fx;
			*dy = *dx;
		}
		*stx = *stp;
		*fx = *fp;
		*dx = *dp;
	}
	/*
	Compute the new step and safeguard it.
	*/

	stpf = pmin(stpmax, stpf);
	stpf = pmax(stpmin, stpf);
	*stp = stpf;
	if (*brackt == 1 && bound == 1) {
		if (*sty > *stx) {
			*stp = pmin(*stx + p66*(*sty - *stx), *stp);
		} else {
			*stp = pmax(*stx + p66*(*sty - *stx), *stp);
		}
	}


	return info;
}